

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

int iq1_find_best_neighbour2
              (uint16_t *neighbours,uint64_t *grid,float *xval,float *weight,float scale,float *xg,
              int8_t *L,int ngrid)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [12];
  unkbyte10 Var3;
  undefined1 auVar4 [12];
  uint uVar5;
  int i_1;
  long lVar6;
  uint64_t *puVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar20 [16];
  ushort uVar22;
  ushort uVar23;
  undefined1 auVar24 [12];
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  ushort uVar42;
  ushort uVar43;
  float fVar44;
  undefined1 auVar45 [16];
  float d2;
  float fVar46;
  float fVar47;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 uVar21;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  uVar22 = *neighbours;
  if (uVar22 == 0) {
    pcVar8 = "num_neighbors > 0";
    iVar11 = 0xfd6;
  }
  else {
    uVar9 = 0xffffffff;
    auVar45._0_12_ = ZEXT812(0x7f7fffff);
    auVar45._12_4_ = 0;
    lVar6 = 1;
    do {
      auVar25 = ZEXT816(0);
      lVar10 = 0;
      do {
        iVar11 = (int)*(char *)((long)grid + lVar10 + (ulong)neighbours[lVar6] * 8);
        fVar46 = xg[(short)((iVar11 - (iVar11 + -1 >> 0x1f)) - 1U >> 1)] * scale - xval[lVar10];
        auVar25._0_4_ = auVar25._0_4_ + weight[lVar10] * fVar46 * fVar46;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      uVar5 = (uint)neighbours[lVar6];
      if (auVar45._0_4_ <= auVar25._0_4_) {
        auVar25._0_4_ = auVar45._0_4_;
        uVar5 = uVar9;
      }
      uVar9 = uVar5;
      auVar24 = auVar25._0_12_;
      lVar6 = lVar6 + 1;
      auVar45 = auVar25;
    } while (lVar6 != (ulong)uVar22 + 1);
    if ((int)uVar9 < 0) {
      uVar9 = 0xffffffff;
      lVar6 = 0;
      puVar7 = grid;
      do {
        fVar46 = 0.0;
        lVar10 = 0;
        do {
          fVar47 = xg[(short)(((int)*(char *)((long)puVar7 + lVar10) -
                              (*(char *)((long)puVar7 + lVar10) + -1 >> 0x1f)) - 1U >> 1)] * scale +
                   -xval[lVar6];
          fVar46 = fVar46 + weight[lVar10] * fVar47 * fVar47;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        uVar5 = (uint)lVar6;
        if (auVar25._0_4_ <= fVar46) {
          fVar46 = auVar25._0_4_;
          uVar5 = uVar9;
        }
        uVar9 = uVar5;
        lVar6 = lVar6 + 1;
        puVar7 = puVar7 + 1;
        auVar25 = ZEXT416((uint)fVar46);
        auVar24._4_8_ = 0;
        auVar24._0_4_ = fVar46;
      } while (lVar6 != 0x800);
    }
    if ((int)uVar9 < 0) {
      puts("Oops, did not find grid point");
      printf("Have %d neighbours\n",(ulong)uVar22);
      uVar12 = 1;
      do {
        fVar46 = 0.0;
        fVar47 = 0.0;
        lVar6 = 0;
        do {
          iVar11 = (int)*(char *)((long)grid + lVar6 + (ulong)neighbours[uVar12] * 8);
          fVar44 = weight[lVar6] * xg[(short)((iVar11 - (iVar11 + -1 >> 0x1f)) - 1U >> 1)];
          fVar46 = fVar46 + xg[(short)((iVar11 - (iVar11 + -1 >> 0x1f)) - 1U >> 1)] * fVar44;
          fVar47 = fVar47 + xval[lVar6] * fVar44;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        auVar24._0_8_ = (double)fVar46;
        auVar24._8_4_ = 0;
        printf("    neighbour %d: sumqx = %g sumq2 = %g\n",(double)fVar47,uVar12 & 0xffffffff);
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar22 + 1 + (uint)(uVar22 == 0));
    }
    if (-1 < (int)uVar9) {
      uVar12 = grid[uVar9];
      uVar21 = (undefined1)(uVar12 >> 0x38);
      auVar19._8_6_ = 0;
      auVar19._0_8_ = uVar12;
      auVar19[0xe] = uVar21;
      auVar19[0xf] = uVar21;
      uVar21 = (undefined1)(uVar12 >> 0x30);
      auVar18._14_2_ = auVar19._14_2_;
      auVar18._8_5_ = 0;
      auVar18._0_8_ = uVar12;
      auVar18[0xd] = uVar21;
      auVar17._13_3_ = auVar18._13_3_;
      auVar17._8_4_ = 0;
      auVar17._0_8_ = uVar12;
      auVar17[0xc] = uVar21;
      uVar21 = (undefined1)(uVar12 >> 0x28);
      auVar16._12_4_ = auVar17._12_4_;
      auVar16._8_3_ = 0;
      auVar16._0_8_ = uVar12;
      auVar16[0xb] = uVar21;
      auVar15._11_5_ = auVar16._11_5_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar12;
      auVar15[10] = uVar21;
      uVar21 = (undefined1)(uVar12 >> 0x20);
      auVar14._10_6_ = auVar15._10_6_;
      auVar14[8] = 0;
      auVar14._0_8_ = uVar12;
      auVar14[9] = uVar21;
      auVar13._9_7_ = auVar14._9_7_;
      auVar13[8] = uVar21;
      auVar13._0_8_ = uVar12;
      uVar21 = (undefined1)(uVar12 >> 0x18);
      Var3 = CONCAT91(CONCAT81(auVar13._8_8_,uVar21),uVar21);
      uVar21 = (undefined1)(uVar12 >> 0x10);
      auVar2._2_10_ = Var3;
      auVar2[1] = uVar21;
      auVar2[0] = uVar21;
      uVar21 = (undefined1)(uVar12 >> 8);
      auVar1._2_12_ = auVar2;
      auVar1[1] = uVar21;
      auVar1[0] = uVar21;
      auVar28._12_2_ = auVar24._6_2_;
      auVar28._0_12_ = auVar24;
      auVar28._14_2_ = (short)Var3;
      auVar27._12_4_ = auVar28._12_4_;
      auVar27._0_10_ = auVar24._0_10_;
      auVar27._10_2_ = auVar2._0_2_;
      auVar26._10_6_ = auVar27._10_6_;
      auVar26._0_8_ = auVar24._0_8_;
      auVar26._8_2_ = auVar24._4_2_;
      auVar4._4_8_ = auVar26._8_8_;
      auVar4._2_2_ = auVar1._0_2_;
      auVar4._0_2_ = auVar24._2_2_;
      auVar20._0_4_ = ((int)auVar13._8_2_ >> 8) + -1;
      auVar20._4_4_ = ((int)auVar15._10_2_ >> 8) + -1;
      auVar20._8_4_ = ((int)auVar17._12_2_ >> 8) + -1;
      auVar20._12_4_ = ((int)auVar18._14_2_ >> 8) + -1;
      auVar29._0_4_ = ((int)CONCAT11((char)uVar12,(char)uVar12) >> 8) + -1;
      auVar29._4_4_ = (auVar4._0_4_ >> 0x18) + -1;
      auVar29._8_4_ = (auVar26._8_4_ >> 0x18) + -1;
      auVar29._12_4_ = (auVar27._12_4_ >> 0x18) + -1;
      auVar45 = packssdw(auVar29,auVar20);
      uVar22 = -(short)(auVar29._0_4_ >> 0x1f);
      uVar23 = -(short)(auVar29._4_4_ >> 0x1f);
      uVar31 = -(short)(auVar29._8_4_ >> 0x1f);
      uVar33 = -(short)(auVar29._12_4_ >> 0x1f);
      uVar35 = -(short)(auVar20._0_4_ >> 0x1f);
      uVar37 = -(short)(auVar20._4_4_ >> 0x1f);
      uVar39 = -(short)(auVar20._8_4_ >> 0x1f);
      uVar41 = -(short)(auVar20._12_4_ >> 0x1f);
      uVar22 = (ushort)((ushort)(byte)((uVar22 != 0) * (uVar22 < 0x100) *
                                       -(char)(auVar29._0_4_ >> 0x1f) - (0xff < uVar22)) +
                       auVar45._0_2_) >> 1;
      uVar30 = (ushort)((ushort)(byte)((uVar23 != 0) * (uVar23 < 0x100) *
                                       -(char)(auVar29._4_4_ >> 0x1f) - (0xff < uVar23)) +
                       auVar45._2_2_) >> 1;
      uVar32 = (ushort)((ushort)(byte)((uVar31 != 0) * (uVar31 < 0x100) *
                                       -(char)(auVar29._8_4_ >> 0x1f) - (0xff < uVar31)) +
                       auVar45._4_2_) >> 1;
      uVar34 = (ushort)((ushort)(byte)((uVar33 != 0) * (uVar33 < 0x100) *
                                       -(char)(auVar29._12_4_ >> 0x1f) - (0xff < uVar33)) +
                       auVar45._6_2_) >> 1;
      uVar36 = (ushort)((ushort)(byte)((uVar35 != 0) * (uVar35 < 0x100) *
                                       -(char)(auVar20._0_4_ >> 0x1f) - (0xff < uVar35)) +
                       auVar45._8_2_) >> 1;
      uVar38 = (ushort)((ushort)(byte)((uVar37 != 0) * (uVar37 < 0x100) *
                                       -(char)(auVar20._4_4_ >> 0x1f) - (0xff < uVar37)) +
                       auVar45._10_2_) >> 1;
      uVar40 = (ushort)((ushort)(byte)((uVar39 != 0) * (uVar39 < 0x100) *
                                       -(char)(auVar20._8_4_ >> 0x1f) - (0xff < uVar39)) +
                       auVar45._12_2_) >> 1;
      uVar42 = (ushort)((ushort)(byte)((uVar41 != 0) * (uVar41 < 0x100) *
                                       -(char)(auVar20._12_4_ >> 0x1f) - (0xff < uVar41)) +
                       auVar45._14_2_) >> 1;
      uVar23 = uVar22 & 0xff;
      uVar31 = uVar30 & 0xff;
      uVar33 = uVar32 & 0xff;
      uVar35 = uVar34 & 0xff;
      uVar37 = uVar36 & 0xff;
      uVar39 = uVar38 & 0xff;
      uVar41 = uVar40 & 0xff;
      uVar43 = uVar42 & 0xff;
      *(ulong *)L = CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)uVar42 - (0xff < uVar43),
                             CONCAT16((uVar41 != 0) * (uVar41 < 0x100) * (char)uVar40 -
                                      (0xff < uVar41),
                                      CONCAT15((uVar39 != 0) * (uVar39 < 0x100) * (char)uVar38 -
                                               (0xff < uVar39),
                                               CONCAT14((uVar37 != 0) * (uVar37 < 0x100) *
                                                        (char)uVar36 - (0xff < uVar37),
                                                        CONCAT13((uVar35 != 0) * (uVar35 < 0x100) *
                                                                 (char)uVar34 - (0xff < uVar35),
                                                                 CONCAT12((uVar33 != 0) *
                                                                          (uVar33 < 0x100) *
                                                                          (char)uVar32 -
                                                                          (0xff < uVar33),
                                                                          CONCAT11((uVar31 != 0) *
                                                                                   (uVar31 < 0x100)
                                                                                   * (char)uVar30 -
                                                                                   (0xff < uVar31),
                                                                                   (uVar23 != 0) *
                                                                                   (uVar23 < 0x100)
                                                                                   * (char)uVar22 -
                                                                                   (0xff < uVar23)))
                                                                )))));
      return uVar9;
    }
    pcVar8 = "grid_index >= 0";
    iVar11 = 0x1006;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-quants.c"
             ,iVar11,"GGML_ASSERT(%s) failed",pcVar8);
}

Assistant:

static int iq1_find_best_neighbour2(const uint16_t * GGML_RESTRICT neighbours, const uint64_t * GGML_RESTRICT grid,
        const float * GGML_RESTRICT xval, const float * GGML_RESTRICT weight, float scale, const float * GGML_RESTRICT xg, int8_t * GGML_RESTRICT L, int ngrid) {
    int num_neighbors = neighbours[0];
    GGML_ASSERT(num_neighbors > 0);
    float best_score = FLT_MAX;
    int grid_index = -1;
    for (int j = 1; j <= num_neighbors; ++j) {
        const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
        float d2 = 0;
        for (int i = 0; i < 8; ++i) {
            float q = xg[(pg[i] - 1)/2];
            float w = weight[i];
            float diff = scale*q - xval[i];
            d2 += w*diff*diff;
        }
        if (d2 < best_score) {
            best_score = d2;
            grid_index = neighbours[j];
        }
    }
    if (grid_index < 0) {
        for (int i = 0; i < ngrid; ++i) {
            const int8_t * grid_i = (const int8_t *)(grid + i);
            float d2 = 0;
            for (int j = 0; j < 8; ++j) {
                float w = weight[j];
                float q = xg[(grid_i[j] - 1)/2];
                float diff = scale*q - xval[i];
                d2 += w*diff*diff;
            }
            if (d2 < best_score) {
                best_score = d2;
                grid_index = i;
            }
        }
    }
    if (grid_index < 0) {
        printf("Oops, did not find grid point\n");
        printf("Have %d neighbours\n", num_neighbors);
        for (int j = 1; j <= num_neighbors; ++j) {
            const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
            float sumqx = 0, sumq2 = 0;
            for (int i = 0; i < 8; ++i) {
                float q = xg[(pg[i] - 1)/2];
                float w = weight[i];
                sumqx += w*q*xval[i];
                sumq2 += w*q*q;
            }
            printf("    neighbour %d: sumqx = %g sumq2 = %g\n", j, (double)sumqx, (double)sumq2);
        }
    }
    GGML_ASSERT(grid_index >= 0);
    const int8_t * pg = (const int8_t *)(grid + grid_index);
    for (int i = 0; i < 8; ++i) L[i] = (pg[i] - 1)/2;
    return grid_index;
}